

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void quantize_row_iq4_nl_impl
               (int super_block_size,int block_size,float *x,ggml_fp16_t *dh,uint8_t *q4,
               uint16_t *scales_h,uint8_t *scales_l,float *scales,float *weight,uint8_t *L,
               int8_t *values,float *quant_weights,int ntry)

{
  float *pfVar1;
  uint8_t *puVar2;
  byte *pbVar3;
  float fVar4;
  uint uVar5;
  int ib;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int j;
  int iVar11;
  long lVar12;
  uint8_t *puVar13;
  int iVar14;
  undefined4 in_register_00000034;
  long lVar15;
  int iVar16;
  int iVar17;
  char cVar18;
  float *pfVar19;
  long lVar20;
  bool bVar21;
  float fVar22;
  anon_union_4_2_5fd15f10 fp32_2;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  anon_union_4_2_5fd15f10 fp32_5;
  anon_union_4_2_5fd15f10 fp32;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 local_78 [16];
  undefined1 local_48 [12];
  float fStack_3c;
  
  lVar10 = CONCAT44(in_register_00000034,block_size);
  if (super_block_size < 1) {
    fVar23 = 0.0;
  }
  else {
    fVar23 = 0.0;
    uVar8 = 0;
    do {
      fVar28 = *(float *)(lVar10 + uVar8 * 4);
      fVar23 = fVar23 + fVar28 * fVar28;
      uVar8 = uVar8 + 1;
    } while ((uint)super_block_size != uVar8);
  }
  memset(dh,0,(ulong)((uint)super_block_size >> 1));
  uVar5 = (uint)super_block_size >> 5;
  if (0x1f < (uint)super_block_size) {
    fVar28 = *(float *)(&DAT_0014ebd0 + (ulong)(0 < (int)values) * 4);
    uVar8 = 0;
    local_78 = ZEXT416(0);
    puVar13 = L;
    lVar20 = lVar10;
    _local_48 = local_78;
    do {
      if (L == (uint8_t *)0x0) {
        lVar12 = 0;
        do {
          pfVar19 = (float *)(lVar20 + lVar12 * 4);
          fVar32 = pfVar19[1];
          fVar22 = pfVar19[2];
          fVar26 = pfVar19[3];
          pfVar1 = scales + lVar12;
          *pfVar1 = *pfVar19 * *pfVar19;
          pfVar1[1] = fVar32 * fVar32;
          pfVar1[2] = fVar22 * fVar22;
          pfVar1[3] = fVar26 * fVar26;
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0x20);
      }
      else {
        lVar12 = 0;
        do {
          fVar32 = *(float *)(puVar13 + lVar12 * 4);
          fVar22 = *(float *)(lVar20 + lVar12 * 4);
          fVar22 = fVar22 * fVar22 + (2.0 / (float)super_block_size) * fVar23;
          if (fVar22 < 0.0) {
            fVar22 = sqrtf(fVar22);
          }
          else {
            fVar22 = SQRT(fVar22);
          }
          scales[lVar12] = fVar32 * fVar22;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x20);
      }
      lVar12 = uVar8 * 0x80 + lVar10;
      lVar9 = 0;
      fVar22 = 0.0;
      fVar32 = 0.0;
      do {
        fVar26 = *(float *)(lVar20 + lVar9 * 4);
        fVar24 = ABS(fVar26);
        fVar22 = (float)(~-(uint)(fVar32 < fVar24) & (uint)fVar22 |
                        (uint)fVar26 & -(uint)(fVar32 < fVar24));
        if (fVar24 <= fVar32) {
          fVar24 = fVar32;
        }
        lVar9 = lVar9 + 1;
        fVar32 = fVar24;
      } while (lVar9 != 0x20);
      if (1e-15 <= fVar24) {
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar32 = 0.0;
        fVar26 = 0.0;
        lVar9 = 0;
        do {
          fVar27 = *(float *)(lVar12 + lVar9 * 4);
          fVar31 = (1.0 / (fVar22 / fVar28)) * fVar27;
          iVar16 = 0;
          if ((-127.0 < fVar31) && (iVar16 = 0xf, fVar31 < 113.0)) {
            iVar16 = 0;
            iVar14 = 0xf;
            do {
              iVar11 = (iVar16 + iVar14) / 2;
              if ((float)(int)kvalues_iq4nl[iVar11] <= fVar31) {
                iVar16 = iVar11;
                iVar11 = iVar14;
              }
              iVar14 = iVar11;
            } while (1 < iVar14 - iVar16);
            iVar16 = iVar14 + -1;
            if ((float)(int)kvalues_iq4nl[iVar14] - fVar31 <=
                fVar31 - (float)(int)(char)(&DAT_0014eb0f)[iVar14]) {
              iVar16 = iVar14;
            }
          }
          *(char *)((long)weight + lVar9 + uVar8 * 0x20) = (char)iVar16;
          fVar31 = (float)(int)kvalues_iq4nl[iVar16] * scales[lVar9];
          fVar24 = fVar24 + fVar31 * fVar27;
          fVar25 = fVar25 + fVar31 * (float)(int)kvalues_iq4nl[iVar16];
          fVar32 = fVar32 + fVar31 * 0.0;
          fVar26 = fVar26 + fVar31 * 0.0;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x20);
        fVar25 = fVar24 / fVar25;
        if (-1 < (int)values) {
          fVar24 = fVar24 * fVar25;
          iVar16 = -(int)values;
          do {
            fVar27 = 0.0;
            fVar31 = 0.0;
            fVar29 = 0.0;
            fVar30 = 0.0;
            lVar9 = 0;
            do {
              fVar4 = *(float *)(lVar12 + lVar9 * 4);
              fVar33 = ((float)(iVar16 + -0x7f) / fVar22) * fVar4;
              if (fVar33 <= -127.0) {
                lVar15 = 0;
              }
              else {
                lVar15 = 0xf;
                if (fVar33 < 113.0) {
                  iVar14 = 0;
                  iVar11 = 0xf;
                  do {
                    iVar17 = (iVar14 + iVar11) / 2;
                    if ((float)(int)kvalues_iq4nl[iVar17] <= fVar33) {
                      iVar14 = iVar17;
                      iVar17 = iVar11;
                    }
                    iVar11 = iVar17;
                  } while (1 < iVar11 - iVar14);
                  iVar14 = iVar11 + -1;
                  if ((float)(int)kvalues_iq4nl[iVar11] - fVar33 <=
                      fVar33 - (float)(int)(char)(&DAT_0014eb0f)[iVar11]) {
                    iVar14 = iVar11;
                  }
                  lVar15 = (long)iVar14;
                }
              }
              fVar33 = (float)(int)kvalues_iq4nl[lVar15] * scales[lVar9];
              fVar27 = fVar27 + fVar33 * fVar4;
              fVar31 = fVar31 + fVar33 * (float)(int)kvalues_iq4nl[lVar15];
              fVar29 = fVar29 + fVar33 * 0.0;
              fVar30 = fVar30 + fVar33 * 0.0;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0x20);
            if (fVar24 * fVar31 < fVar27 * fVar27 && 0.0 < fVar31) {
              fVar25 = fVar27 / fVar31;
              fVar24 = fVar27 * fVar25;
              fVar32 = fVar29;
              fVar26 = fVar30;
            }
            bVar21 = iVar16 != (int)values;
            iVar16 = iVar16 + 1;
          } while (bVar21);
        }
        *(float *)(scales_l + uVar8 * 4) = fVar25;
        fVar24 = ABS(fVar25);
        fVar22 = fVar24;
        if (fVar24 <= (float)local_48._0_4_) {
          fVar22 = (float)local_48._0_4_;
        }
        local_78._0_4_ =
             ~-(uint)((float)local_48._0_4_ < fVar24) & local_78._0_4_ |
             (uint)fVar25 & -(uint)((float)local_48._0_4_ < fVar24);
        local_78._8_4_ = ~local_48._8_4_ & local_78._8_4_ | (uint)fVar32 & local_48._8_4_;
        local_78._12_4_ = ~(uint)fStack_3c & local_78._12_4_ | (uint)fVar26 & (uint)fStack_3c;
        local_48._4_4_ = 0;
        local_48._0_4_ = fVar22;
        local_48._8_4_ = ABS(fVar32);
        fStack_3c = ABS(fVar26);
      }
      else {
        puVar2 = scales_l + uVar8 * 4;
        puVar2[0] = '\0';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
      }
      uVar8 = uVar8 + 1;
      lVar20 = lVar20 + 0x80;
      puVar13 = puVar13 + 0x80;
    } while (uVar8 != uVar5);
    if (0x3f < (uint)super_block_size) {
      fVar28 = (float)local_78._0_4_ * -0.03125;
      q4[0] = '\0';
      q4[1] = '\0';
      fVar23 = 2.0;
      if (0x70ffffff < (uint)((int)fVar28 * 2)) {
        fVar23 = (float)(((uint)fVar28 & 0x7f800000) + 0x7800000);
      }
      fVar23 = fVar23 + ABS(fVar28) * 5.192297e+33 * 7.70372e-34;
      uVar6 = 0x7e00;
      if ((uint)((int)fVar28 * 2) < 0xff000001) {
        uVar6 = (SUB42(fVar23,0) & 0xfff) + ((ushort)((uint)fVar23 >> 0xd) & 0x7c00);
      }
      *(ushort *)x = uVar6 | (ushort)((uint)fVar28 >> 0x10) & 0x8000;
      uVar8 = 0;
      do {
        uVar7 = (uint)(*(float *)(scales_l + uVar8 * 4) *
                       (float)(-(uint)(fVar28 != 0.0) & (uint)(1.0 / fVar28)) + 12582912.0) &
                0x7fffff;
        if (0x40001e < uVar7) {
          uVar7 = 0x40001f;
        }
        if (uVar7 < 0x3fffe1) {
          uVar7 = 0x3fffe0;
        }
        fVar23 = (float)(int)(uVar7 - 0x400000) * fVar28;
        lVar20 = 0;
        do {
          fVar32 = *(float *)(uVar8 * 0x80 + lVar10 + lVar20 * 4) *
                   (float)(-(uint)(fVar23 != 0.0) & (uint)(1.0 / fVar23));
          if (fVar32 <= -127.0) {
            cVar18 = '\0';
          }
          else {
            cVar18 = '\x0f';
            if (fVar32 < 113.0) {
              iVar16 = 0;
              iVar14 = 0xf;
              do {
                iVar11 = (iVar16 + iVar14) / 2;
                if ((float)(int)kvalues_iq4nl[iVar11] <= fVar32) {
                  iVar16 = iVar11;
                  iVar11 = iVar14;
                }
                iVar14 = iVar11;
              } while (1 < iVar14 - iVar16);
              cVar18 = (char)iVar14 + -1;
              if ((float)(int)kvalues_iq4nl[iVar14] - fVar32 <=
                  fVar32 - (float)(int)(char)(&DAT_0014eb0f)[iVar14]) {
                cVar18 = (char)iVar14;
              }
            }
          }
          *(char *)((long)weight + lVar20 + uVar8 * 0x20) = cVar18;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0x20);
        if ((uVar8 & 1) == 0) {
          *(byte *)((long)scales_h + (uVar8 >> 1 & 0x7fffffff)) = (byte)uVar7 & 0xf;
        }
        else {
          pbVar3 = (byte *)((long)scales_h + (uVar8 >> 1 & 0x7fffffff));
          *pbVar3 = *pbVar3 | (byte)uVar7 << 4;
        }
        *(ushort *)(q4 + (uVar8 >> 3 & 0x1fffffff) * 2) =
             *(ushort *)(q4 + (uVar8 >> 3 & 0x1fffffff) * 2) |
             (ushort)((uVar7 + 0x20 >> 4 & 0xff) << ((char)uVar8 * '\x02' & 0xeU));
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar5);
      goto LAB_00139bba;
    }
  }
  fVar23 = *(float *)scales_l;
  fVar28 = 2.0;
  if (0x70ffffff < (uint)((int)fVar23 * 2)) {
    fVar28 = (float)(((uint)fVar23 & 0x7f800000) + 0x7800000);
  }
  fVar28 = fVar28 + ABS(fVar23) * 5.192297e+33 * 7.70372e-34;
  uVar6 = 0x7e00;
  if ((uint)((int)fVar23 * 2) < 0xff000001) {
    uVar6 = (SUB42(fVar28,0) & 0xfff) + ((ushort)((uint)fVar28 >> 0xd) & 0x7c00);
  }
  *(ushort *)x = uVar6 | (ushort)((uint)fVar23 >> 0x10) & 0x8000;
  if (0 < (int)values) {
    if (super_block_size == 0) {
      return;
    }
    uVar8 = 0;
    do {
      fVar28 = *(float *)(lVar10 + uVar8 * 4) *
               (float)(-(uint)(fVar23 != 0.0) & (uint)(1.0 / fVar23));
      if (fVar28 <= -127.0) {
        cVar18 = '\0';
      }
      else {
        cVar18 = '\x0f';
        if (fVar28 < 113.0) {
          iVar16 = 0;
          iVar14 = 0xf;
          do {
            iVar11 = (iVar16 + iVar14) / 2;
            if ((float)(int)kvalues_iq4nl[iVar11] <= fVar28) {
              iVar16 = iVar11;
              iVar11 = iVar14;
            }
            iVar14 = iVar11;
          } while (1 < iVar14 - iVar16);
          cVar18 = (char)iVar14 + -1;
          if ((float)(int)kvalues_iq4nl[iVar14] - fVar28 <=
              fVar28 - (float)(int)(char)(&DAT_0014eb0f)[iVar14]) {
            cVar18 = (char)iVar14;
          }
        }
      }
      *(char *)((long)weight + uVar8) = cVar18;
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)super_block_size);
  }
LAB_00139bba:
  if (0x1f < (uint)super_block_size) {
    pfVar19 = weight + 4;
    uVar8 = 0;
    do {
      lVar10 = 0;
      do {
        *(byte *)((long)dh + lVar10) =
             *(char *)((long)pfVar19 + lVar10) << 4 | *(byte *)((long)pfVar19 + lVar10 + -0x10);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x10);
      uVar8 = uVar8 + 1;
      dh = dh + 8;
      pfVar19 = pfVar19 + 8;
    } while (uVar8 != uVar5);
  }
  return;
}

Assistant:

static void quantize_row_iq4_nl_impl(const int super_block_size, const int block_size, const float * GGML_RESTRICT x,
        ggml_fp16_t * dh, uint8_t * q4, uint16_t * scales_h, uint8_t * scales_l,
        float * scales, float * weight, uint8_t * L,
        const int8_t * values,
        const float * quant_weights,
        const int ntry) {

    float sigma2 = 0;
    for (int j = 0; j < super_block_size; ++j) sigma2 += x[j]*x[j];
    sigma2 *= 2.f/super_block_size;

    memset(q4, 0, super_block_size/2);
    dh[0] = GGML_FP32_TO_FP16(0.f);

    float max_scale = 0, amax_scale = 0;
    for (int ib = 0; ib < super_block_size/block_size; ++ib) {
        const float * xb = x + ib*block_size;
        uint8_t * Lb = L + ib*block_size;
        if (quant_weights) {
            const float * qw = quant_weights + ib*block_size;
            for (int j = 0; j < block_size; ++j) weight[j] = qw[j] * sqrtf(sigma2 + xb[j]*xb[j]);
        } else {
            for (int j = 0; j < block_size; ++j) weight[j] = xb[j]*xb[j];
        }
        float amax = 0, max = 0;
        for (int j = 0; j < block_size; ++j) {
            float ax = fabsf(xb[j]);
            if (ax > amax) {
                amax = ax; max = xb[j];
            }
        }
        if (amax < GROUP_MAX_EPS) {
            scales[ib] = 0;
            continue;
        }
        float d = ntry > 0 ? -max/values[0] : max/values[0];
        float id = 1/d;
        float sumqx = 0, sumq2 = 0;
        for (int j = 0; j < block_size; ++j) {
            float al = id*xb[j];
            int l = best_index_int8(16, values, al);
            Lb[j] = l;
            float q = values[l];
            float w = weight[j];
            sumqx += w*q*xb[j];
            sumq2 += w*q*q;
        }
        d = sumqx/sumq2;
        float best = d*sumqx;
        for (int itry = -ntry; itry <= ntry; ++itry) {
            id = (itry + values[0])/max;
            sumqx = sumq2 = 0;
            for (int j = 0; j < block_size; ++j) {
                float al = id*xb[j];
                int l = best_index_int8(16, values, al);
                float q = values[l];
                float w = weight[j];
                sumqx += w*q*xb[j];
                sumq2 += w*q*q;
            }
            if (sumq2 > 0 && sumqx*sumqx > best*sumq2) {
                d = sumqx/sumq2; best = d * sumqx;
            }
        }
        scales[ib] = d;
        float abs_d = fabsf(d);
        if (abs_d > amax_scale) {
            amax_scale = abs_d; max_scale = d;
        }
    }

    if (super_block_size/block_size > 1) {
        int nb = super_block_size/block_size;
        memset(scales_h, 0, ((nb+7)/8)*sizeof(uint16_t));
        float d = -max_scale/32;
        dh[0] = GGML_FP32_TO_FP16(d);
        float id = d ? 1/d : 0.f;
        for (int ib = 0; ib < super_block_size/block_size; ++ib) {
            int l = nearest_int(id*scales[ib]);
            l = MAX(-32, MIN(31, l));
            float dl = d * l;
            float idl = dl ? 1/dl : 0.f;
            uint8_t * Lb = L + ib*block_size;
            const float * xb = x + ib*block_size;
            for (int j = 0; j < block_size; ++j) {
                Lb[j] = best_index_int8(16, values, idl*xb[j]);
            }
            l += 32;
            uint8_t l_l = l & 0xf;
            uint8_t l_h = l >>  4;
            if (ib%2 == 0) scales_l[ib/2] = l_l;
            else scales_l[ib/2] |= (l_l << 4);
            scales_h[ib/8] |= (l_h << 2*(ib%8));
        }
    } else {
        dh[0] = GGML_FP32_TO_FP16(scales[0]);
        if (ntry > 0) {
            float id = scales[0] ? 1/scales[0] : 0;
            for (int j = 0; j < super_block_size; ++j) {
                L[j] = best_index_int8(16, values, id*x[j]);
            }
        }
    }

    for (int i = 0; i < super_block_size/32; ++i) {
        for (int j = 0; j < 16; ++j) {
            q4[16*i + j] = L[32*i + j] | (L[32*i + 16 + j] << 4);
        }
    }
}